

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::WBClearObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,char *addr)

{
  undefined4 *puVar1;
  code *pcVar2;
  byte *pbVar3;
  bool bVar4;
  uint i;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  uchar retval;
  
  if ((uint)((int)addr - *(int *)&(this->super_HeapBlock).address) % (uint)this->objectSize != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.h"
                       ,0x275,"((uint)(addr - this->address) % this->objectSize == 0)",
                       "(uint)(addr - this->address) % this->objectSize == 0");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (7 < this->objectSize) {
    i = (uint)((int)addr - *(int *)&(this->super_HeapBlock).address) >> 3;
    uVar5 = (uint)(this->objectSize >> 3);
    do {
      BVStatic<4096UL>::AssertRange(&this->wbVerifyBits,i);
      LOCK();
      pbVar3 = (byte *)((long)&(this->wbVerifyBits).data[0].word + ((long)(int)i >> 3));
      *pbVar3 = *pbVar3 & ~('\x01' << (i & 7));
      UNLOCK();
      i = i + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

virtual void WBClearObject(char* addr) override
    {
        Assert((uint)(addr - this->address) % this->objectSize == 0);
        uint index = (uint)(addr - this->address) / sizeof(void*);
        uint count = (uint)(this->objectSize / sizeof(void*));
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.TestAndClearInterlocked(index + i);
        }
    }